

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

void advance_engine<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>>
               (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *r1,long N)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < N) {
    uVar3 = (ulong)(r1->S).index;
    do {
      iVar1 = (int)uVar3;
      uVar2 = iVar1 + 1U & 0x3ff;
      uVar3 = (ulong)uVar2;
      (r1->S).r[uVar3] =
           (r1->S).r[iVar1 + 0x334U & 0x3ff] ^ (r1->S).r[iVar1 + 0x359U & 0x3ff] ^
           (r1->S).r[iVar1 + 0x30fU & 0x3ff] ^ (r1->S).r[iVar1 + 0x1f8U & 0x3ff];
      N = N + -1;
    } while (N != 0);
    (r1->S).index = uVar2;
  }
  return;
}

Assistant:

void advance_engine(R &r1, const long N) {
  for (long i{0}; i < N; ++i)
    r1();
}